

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_parse.cpp
# Opt level: O1

void SetImplicitArgs(TArray<PType_*,_PType_*> *args,TArray<unsigned_int,_unsigned_int> *argflags,
                    PClassActor *cls,DWORD funcflags)

{
  uint uVar1;
  PStatePointer *pPVar2;
  PClassPointer *pPVar3;
  
  if ((args != (TArray<PType_*,_PType_*> *)0x0) && (args->Count != 0)) {
    __assert_fail("args == NULL || args->Size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_parse.cpp"
                  ,0x1a0,
                  "void SetImplicitArgs(TArray<PType *> *, TArray<DWORD> *, PClassActor *, DWORD)");
  }
  if ((argflags != (TArray<unsigned_int,_unsigned_int> *)0x0) && (argflags->Count != 0)) {
    __assert_fail("argflags == NULL || argflags->Size() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_parse.cpp"
                  ,0x1a1,
                  "void SetImplicitArgs(TArray<PType *> *, TArray<DWORD> *, PClassActor *, DWORD)");
  }
  if ((funcflags & 2) != 0) {
    if (args != (TArray<PType_*,_PType_*> *)0x0) {
      pPVar3 = NewClassPointer(&cls->super_PClass);
      TArray<PType_*,_PType_*>::Grow(args,1);
      uVar1 = args->Count;
      args->Array[uVar1] = (PType *)pPVar3;
      args->Count = uVar1 + 1;
    }
    if (argflags != (TArray<unsigned_int,_unsigned_int> *)0x0) {
      TArray<unsigned_int,_unsigned_int>::Grow(argflags,1);
      argflags->Array[argflags->Count] = 0;
      argflags->Count = argflags->Count + 1;
    }
  }
  if ((funcflags & 4) != 0) {
    if (args != (TArray<PType_*,_PType_*> *)0x0) {
      pPVar3 = NewClassPointer(AActor::RegistrationInfo.MyClass);
      TArray<PType_*,_PType_*>::Grow(args,1);
      uVar1 = args->Count;
      args->Array[uVar1] = (PType *)pPVar3;
      args->Count = uVar1 + 1;
      pPVar2 = TypeState;
      TArray<PType_*,_PType_*>::Grow(args,1);
      uVar1 = args->Count;
      args->Array[uVar1] = (PType *)pPVar2;
      args->Count = uVar1 + 1;
    }
    if (argflags != (TArray<unsigned_int,_unsigned_int> *)0x0) {
      TArray<unsigned_int,_unsigned_int>::Grow(argflags,1);
      argflags->Array[argflags->Count] = 0;
      argflags->Count = argflags->Count + 1;
      TArray<unsigned_int,_unsigned_int>::Grow(argflags,1);
      argflags->Array[argflags->Count] = 0;
      argflags->Count = argflags->Count + 1;
    }
  }
  return;
}

Assistant:

void SetImplicitArgs(TArray<PType *> *args, TArray<DWORD> *argflags, PClassActor *cls, DWORD funcflags)
{
	// Must be called before adding any other arguments.
	assert(args == NULL || args->Size() == 0);
	assert(argflags == NULL || argflags->Size() == 0);

	if (funcflags & VARF_Method)
	{
		// implied self pointer
		if (args != NULL)		args->Push(NewClassPointer(cls));
		if (argflags != NULL)	argflags->Push(0);
	}
	if (funcflags & VARF_Action)
	{
		// implied stateowner and callingstate pointers
		if (args != NULL)
		{
			args->Push(NewClassPointer(RUNTIME_CLASS(AActor)));
			args->Push(TypeState);
		}
		if (argflags != NULL)
		{
			argflags->Push(0);
			argflags->Push(0);
		}
	}
}